

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastStFld
          (Lowerer *this,Instr *instrStFld,JnHelperMethod helperMethod,
          JnHelperMethod polymorphicHelperMethod,LabelInstr **labelBailOut,RegOpnd *typeOpnd,
          bool *pIsHelper,LabelInstr **pLabelHelper,bool withPutFlags,PropertyOperationFlags flags)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint16 uVar7;
  uint uVar8;
  uint uVar9;
  Opnd *opndSrc_00;
  Opnd *pOVar10;
  SymOpnd *pSVar11;
  undefined4 *puVar12;
  PropertySymOpnd *propertySymOpnd_00;
  PropertySym *pPVar13;
  FldInfo *pFVar14;
  LabelInstr *pLVar15;
  RegOpnd *opndBase_00;
  JITTimeFunctionBody *pJVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  RegOpnd *opndInlineCache_00;
  intptr_t address;
  AddrOpnd *src;
  LowererMD *pLVar19;
  char16_t *pcVar20;
  bool bVar21;
  bool bVar22;
  char16_t *local_1b8;
  BranchInstr *local_168;
  BranchInstr *lastBranchToNext;
  RegOpnd *opndTaggedType;
  LabelInstr *labelNext;
  RegOpnd *opndInlineCache;
  char16 debugStringBuffer_1 [42];
  bool usePolymorphicInlineCache;
  RegOpnd *opndBase;
  LabelInstr *labelFallThru;
  char16 debugStringBuffer [42];
  ProfiledInstr *profiledInstrStFld;
  bool doAuxSlots;
  bool doInlineSlots;
  bool doAdd;
  bool doStore;
  LabelInstr **labelHelper;
  bool *isHelper;
  PropertySym *propertySym;
  PropertySymOpnd *propertySymOpnd;
  Opnd *opndDst;
  Opnd *opndSrc;
  RegOpnd *pRStack_38;
  bool withPutFlags_local;
  RegOpnd *typeOpnd_local;
  LabelInstr **labelBailOut_local;
  JnHelperMethod polymorphicHelperMethod_local;
  JnHelperMethod helperMethod_local;
  Instr *instrStFld_local;
  Lowerer *this_local;
  
  opndSrc_00 = IR::Instr::GetSrc1(instrStFld);
  pOVar10 = IR::Instr::GetDst(instrStFld);
  bVar4 = IR::Opnd::IsSymOpnd(pOVar10);
  if (bVar4) {
    pSVar11 = IR::Opnd::AsSymOpnd(pOVar10);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar11);
    if (bVar4) {
      pSVar11 = IR::Opnd::AsSymOpnd(pOVar10);
      bVar4 = Sym::IsPropertySym(pSVar11->m_sym);
      if (bVar4) goto LAB_007c2390;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar12 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x596e,
                     "(opndDst->IsSymOpnd() && opndDst->AsSymOpnd()->IsPropertySymOpnd() && opndDst->AsSymOpnd()->m_sym->IsPropertySym())"
                     ,"Expected PropertySym as dst of StFld");
  if (!bVar4) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar12 = 0;
LAB_007c2390:
  propertySymOpnd_00 = IR::Opnd::AsPropertySymOpnd(pOVar10);
  pPVar13 = Sym::AsPropertySym((propertySymOpnd_00->super_SymOpnd).m_sym);
  uVar8 = Func::GetSourceContextId(this->m_func);
  uVar9 = Func::GetLocalFunctionId(this->m_func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ObjTypeSpecPhase,uVar8,uVar9);
  if (bVar4) {
    pcVar17 = Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode);
    uVar1 = pPVar13->m_propertyId;
    pJVar16 = Func::GetJITFunctionBody(this->m_func);
    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
    Output::Print(L"Field store: %s, property ID: %u, func: %s, cache ID: %d, cloned cache: false\n"
                  ,pcVar17,(ulong)uVar1,pcVar18);
    Output::Flush();
  }
  if (pIsHelper == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x597b,"(pIsHelper != nullptr)","pIsHelper != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  if (pLabelHelper == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x597e,"(pLabelHelper != nullptr)","pLabelHelper != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar4 = true;
  bVar21 = false;
  bVar22 = true;
  bVar3 = true;
  uVar8 = Func::GetSourceContextId(this->m_func);
  uVar9 = Func::GetLocalFunctionId(this->m_func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ProfileBasedFldFastPathPhase,uVar8,uVar9);
  if ((!bVar5) && (bVar5 = IR::Instr::IsProfiledInstr(instrStFld), bVar5)) {
    register0x00000000 = IR::Instr::AsProfiledInstr(instrStFld);
    pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                        ((anon_union_8_4_88fdcd80 *)&(register0x00000000->u).field_3);
    if (pFVar14->flags == FldInfo_NoInfo) {
      pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                          ((anon_union_8_4_88fdcd80 *)&(stack0xffffffffffffff80->u).field_3);
      bVar5 = ValueType::IsUninitialized(&pFVar14->valueType);
      if (!bVar5) {
        return false;
      }
    }
    else {
      pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                          ((anon_union_8_4_88fdcd80 *)&(stack0xffffffffffffff80->u).field_3);
      if ((pFVar14->flags & (FldInfo_FromLocalWithoutProperty|FldInfo_FromLocal)) == FldInfo_NoInfo)
      {
        return false;
      }
      uVar8 = Func::GetSourceContextId(this->m_func);
      uVar9 = Func::GetLocalFunctionId(this->m_func);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,AddFldFastPathPhase,uVar8,uVar9);
      if (bVar5) {
        uVar8 = Func::GetSourceContextId(this->m_func);
        uVar9 = Func::GetLocalFunctionId(this->m_func);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AddFldFastPathPhase,uVar8,uVar9);
        if (bVar5) {
          pJVar16 = Func::GetJITFunctionBody(this->m_func);
          pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
          pcVar18 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])&labelFallThru);
          Output::Print(L"AddFldFastPath: function: %s(%s) property ID: %u no fast path, because the phase is off.\n"
                        ,pcVar17,pcVar18,(ulong)(uint)pPVar13->m_propertyId);
          Output::Flush();
        }
      }
      else {
        pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                            ((anon_union_8_4_88fdcd80 *)&(stack0xffffffffffffff80->u).field_3);
        bVar4 = (pFVar14->flags & (FldInfo_FromLocalWithoutProperty|FldInfo_FromLocal)) !=
                FldInfo_FromLocalWithoutProperty;
        pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                            ((anon_union_8_4_88fdcd80 *)&(stack0xffffffffffffff80->u).field_3);
        bVar21 = (pFVar14->flags & FldInfo_FromLocalWithoutProperty) != FldInfo_NoInfo;
      }
      pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                          ((anon_union_8_4_88fdcd80 *)&(stack0xffffffffffffff80->u).field_3);
      if ((pFVar14->flags & (FldInfo_FromAuxSlots|FldInfo_FromInlineSlots)) ==
          FldInfo_FromInlineSlots) {
        bVar3 = false;
      }
      else {
        pFVar14 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                            ((anon_union_8_4_88fdcd80 *)&(stack0xffffffffffffff80->u).field_3);
        bVar22 = (pFVar14->flags & (FldInfo_FromAuxSlots|FldInfo_FromInlineSlots)) !=
                 FldInfo_FromAuxSlots;
      }
    }
  }
  if ((!bVar4) && (!bVar21)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x59bb,"(doStore || doAdd)","doStore || doAdd");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  if (*pLabelHelper == (LabelInstr *)0x0) {
    pLVar15 = IR::LabelInstr::New(Label,this->m_func,true);
    *pLabelHelper = pLVar15;
  }
  pLVar15 = IR::Instr::GetOrCreateContinueLabel(instrStFld,false);
  opndBase_00 = IR::SymOpnd::CreatePropertyOwnerOpnd
                          (&propertySymOpnd_00->super_SymOpnd,this->m_func);
  bVar5 = propertySymOpnd_00->m_runtimePolymorphicInlineCache !=
          (JITTimePolymorphicInlineCache *)0x0;
  if (bVar21) {
    uVar8 = Func::GetSourceContextId(this->m_func);
    uVar9 = Func::GetLocalFunctionId(this->m_func);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AddFldFastPathPhase,uVar8,uVar9);
    if (bVar6) {
      pJVar16 = Func::GetJITFunctionBody(this->m_func);
      pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
      pcVar18 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])&opndInlineCache);
      if (bVar5) {
        local_1b8 = L"poly";
      }
      else {
        local_1b8 = L"mono";
      }
      pcVar20 = L"add only";
      if (bVar4) {
        pcVar20 = L"store and add";
      }
      Output::Print(L"AddFldFastPath: function: %s(%s) property ID: %d %s fast path for %s.\n",
                    pcVar17,pcVar18,(ulong)(uint)pPVar13->m_propertyId,local_1b8,pcVar20);
      Output::Flush();
    }
  }
  opndInlineCache_00 = IR::RegOpnd::New(TyUint64,this->m_func);
  if (bVar5) {
    address = JITTimePolymorphicInlineCache::GetInlineCachesAddr
                        (propertySymOpnd_00->m_runtimePolymorphicInlineCache);
    src = IR::AddrOpnd::New(address,AddrOpndKindDynamicInlineCache,this->m_func,true,(Var)0x0);
    InsertMove(&opndInlineCache_00->super_Opnd,&src->super_Opnd,instrStFld,true);
  }
  else {
    pOVar10 = LoadRuntimeInlineCacheOpnd(this,instrStFld,propertySymOpnd_00,(bool)(*pIsHelper & 1));
    InsertMove(&opndInlineCache_00->super_Opnd,pOVar10,instrStFld,true);
  }
  pRStack_38 = typeOpnd;
  if (typeOpnd == (RegOpnd *)0x0) {
    pRStack_38 = IR::RegOpnd::New(TyUint64,this->m_func);
    GenerateObjectTestAndTypeLoad(this,instrStFld,opndBase_00,pRStack_38,*pLabelHelper);
  }
  if (bVar5) {
    uVar7 = JITTimePolymorphicInlineCache::GetSize
                      (propertySymOpnd_00->m_runtimePolymorphicInlineCache);
    LowererMD::GenerateLoadPolymorphicInlineCacheSlot
              (instrStFld,opndInlineCache_00,pRStack_38,(uint)uVar7);
  }
  opndTaggedType = (RegOpnd *)0x0;
  lastBranchToNext = (BranchInstr *)0x0;
  local_168 = (BranchInstr *)0x0;
  if (bVar4) {
    if (bVar22) {
      opndTaggedType = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,(bool)(*pIsHelper & 1));
      local_168 = GenerateLocalInlineCacheCheck
                            (instrStFld,pRStack_38,opndInlineCache_00,(LabelInstr *)opndTaggedType,
                             false);
      pLVar19 = GetLowererMD(this);
      LowererMD::GenerateStFldFromLocalInlineCache
                (pLVar19,instrStFld,opndBase_00,opndSrc_00,opndInlineCache_00,pLVar15,true);
      IR::Instr::InsertBefore(instrStFld,(Instr *)opndTaggedType);
    }
    if (bVar3) {
      lastBranchToNext = (BranchInstr *)IR::RegOpnd::New(TyUint64,this->m_func);
      LowererMD::GenerateLoadTaggedType(instrStFld,pRStack_38,(RegOpnd *)lastBranchToNext);
      opndTaggedType = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,(bool)(*pIsHelper & 1));
      local_168 = GenerateLocalInlineCacheCheck
                            (instrStFld,(RegOpnd *)lastBranchToNext,opndInlineCache_00,
                             (LabelInstr *)opndTaggedType,false);
      pLVar19 = GetLowererMD(this);
      LowererMD::GenerateStFldFromLocalInlineCache
                (pLVar19,instrStFld,opndBase_00,opndSrc_00,opndInlineCache_00,pLVar15,false);
      IR::Instr::InsertBefore(instrStFld,(Instr *)opndTaggedType);
    }
  }
  if (bVar21) {
    if (bVar22) {
      opndTaggedType = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,(bool)(*pIsHelper & 1));
      local_168 = GenerateLocalInlineCacheCheck
                            (instrStFld,pRStack_38,opndInlineCache_00,(LabelInstr *)opndTaggedType,
                             true);
      GenerateSetObjectTypeFromInlineCache(this,instrStFld,opndBase_00,opndInlineCache_00,false);
      pLVar19 = GetLowererMD(this);
      LowererMD::GenerateStFldFromLocalInlineCache
                (pLVar19,instrStFld,opndBase_00,opndSrc_00,opndInlineCache_00,pLVar15,true);
      IR::Instr::InsertBefore(instrStFld,(Instr *)opndTaggedType);
    }
    if (bVar3) {
      if (lastBranchToNext == (BranchInstr *)0x0) {
        lastBranchToNext = (BranchInstr *)IR::RegOpnd::New(TyUint64,this->m_func);
        LowererMD::GenerateLoadTaggedType(instrStFld,pRStack_38,(RegOpnd *)lastBranchToNext);
      }
      opndTaggedType = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
      local_168 = GenerateLocalInlineCacheCheck
                            (instrStFld,(RegOpnd *)lastBranchToNext,opndInlineCache_00,
                             (LabelInstr *)opndTaggedType,true);
      GenerateAuxSlotAdjustmentRequiredCheck(this,instrStFld,opndInlineCache_00,*pLabelHelper);
      GenerateSetObjectTypeFromInlineCache(this,instrStFld,opndBase_00,opndInlineCache_00,true);
      pLVar19 = GetLowererMD(this);
      LowererMD::GenerateStFldFromLocalInlineCache
                (pLVar19,instrStFld,opndBase_00,opndSrc_00,opndInlineCache_00,pLVar15,false);
      IR::Instr::InsertBefore(instrStFld,(Instr *)opndTaggedType);
    }
  }
  if (local_168 == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a1c,"(lastBranchToNext)","lastBranchToNext");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  IR::BranchInstr::SetTarget(local_168,*pLabelHelper);
  IR::Instr::Remove((Instr *)opndTaggedType);
  *pIsHelper = true;
  return false;
}

Assistant:

bool
Lowerer::GenerateFastStFld(IR::Instr * const instrStFld, IR::JnHelperMethod helperMethod, IR::JnHelperMethod polymorphicHelperMethod, IR::LabelInstr ** labelBailOut, IR::RegOpnd* typeOpnd,
    bool* pIsHelper, IR::LabelInstr** pLabelHelper, bool withPutFlags, Js::PropertyOperationFlags flags)
{
    // Generates:
    //
    // r1 = object->type
    // if (r1 is taggedInt) goto helper
    // Load inline cache
    //    if monomorphic
    //        r2 = address of the monomorphic inline cache
    //    if polymorphic
    //        r2 = address of the polymorphic inline cache array
    //        r3 = (type >> PIC shift amount) & (PIC size - 1)
    //        r2 = r2 + r3
    // Try store property using local cache
    //
    // Loading property using local cache:
    //    if (r1 == r2->u.local.type)
    //        store value to inline slot r2->u.local.slotIndex on r1
    //        goto fallthru
    //    if ((r1 | InlineCacheAuxSlotTypeTag) == r2->u.local.type)
    //        store value to aux slot r2->u.local.slotIndex on r1
    //        goto fallthru
    //
    // Storing to an inline slot:
    //    [r1 + slotIndex * sizeof(Var)] = value
    //
    // Storing to an aux slot:
    //    slotArray = r1->auxSlots
    //    [slotArray + slotIndex * sizeof(Var)] = value
    //
    // We don't emit the type check with aux slot tag if the profile data indicates that we didn't
    // store the property to an aux slot before.
    // We don't emit the type check without an aux slot tag if the profile data indicates that we didn't
    // store the property to an inline slot before.

    IR::Opnd * opndSrc = instrStFld->GetSrc1();
    IR::Opnd * opndDst = instrStFld->GetDst();
    AssertMsg(opndDst->IsSymOpnd() && opndDst->AsSymOpnd()->IsPropertySymOpnd() && opndDst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected PropertySym as dst of StFld");

    IR::PropertySymOpnd * propertySymOpnd = opndDst->AsPropertySymOpnd();
    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %u, func: %s, cache ID: %d, cloned cache: false\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySym->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex);

    Assert(pIsHelper != nullptr);
    bool& isHelper = *pIsHelper;

    Assert(pLabelHelper != nullptr);
    IR::LabelInstr*& labelHelper = *pLabelHelper;

    bool doStore = true;
    bool doAdd = false;
    bool doInlineSlots = true;
    bool doAuxSlots = true;
    if (!PHASE_OFF(Js::ProfileBasedFldFastPathPhase, this->m_func) && instrStFld->IsProfiledInstr())
    {
        IR::ProfiledInstr * profiledInstrStFld = instrStFld->AsProfiledInstr();
        if (profiledInstrStFld->u.FldInfo().flags != Js::FldInfo_NoInfo)
        {
            if (!(profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromLocalWithoutProperty)))
            {
                return false;
            }

            if (!PHASE_OFF(Js::AddFldFastPathPhase, this->m_func))
            {
                // We always try to do the store field fast path, unless the profile specifically says we never set, but always add a property here.
                if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromLocalWithoutProperty)) == Js::FldInfo_FromLocalWithoutProperty)
                {
                    doStore = false;
                }

                // On the other hand, we only emit the add field fast path, if the profile explicitly says we do add properties here.
                if (!!(profiledInstrStFld->u.FldInfo().flags & Js::FldInfo_FromLocalWithoutProperty))
                {
                    doAdd = true;
                }
            }
            else
            {
                #if ENABLE_DEBUG_CONFIG_OPTIONS
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                #endif
                PHASE_PRINT_TRACE(Js::AddFldFastPathPhase, this->m_func,
                    _u("AddFldFastPath: function: %s(%s) property ID: %u no fast path, because the phase is off.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    propertySym->m_propertyId);
            }

            if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromInlineSlots | Js::FldInfo_FromAuxSlots)) == Js::FldInfo_FromInlineSlots)
            {
                // If the inline slots flag is set and the aux slots flag is not, only generate the inline slots check
                doAuxSlots = false;
            }
            else if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromInlineSlots | Js::FldInfo_FromAuxSlots)) == Js::FldInfo_FromAuxSlots)
            {
                // If the aux slots flag is set and the inline slots flag is not, only generate the aux slots check
                doInlineSlots = false;
            }
        }
        else if (!profiledInstrStFld->u.FldInfo().valueType.IsUninitialized())
        {
            // We have value type info about the field but no flags. This means we shouldn't generate any
            // fast paths for this field store.
            return false;
        }
    }

    Assert(doStore || doAdd);

    if (labelHelper == nullptr)
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    }

    IR::LabelInstr * labelFallThru = instrStFld->GetOrCreateContinueLabel();
    IR::RegOpnd * opndBase = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
    bool usePolymorphicInlineCache = !!propertySymOpnd->m_runtimePolymorphicInlineCache;

    if (doAdd)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        PHASE_PRINT_TRACE(Js::AddFldFastPathPhase, this->m_func,
            _u("AddFldFastPath: function: %s(%s) property ID: %d %s fast path for %s.\n"),
            this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
            propertySym->m_propertyId,
            usePolymorphicInlineCache ? _u("poly") : _u("mono"), doStore ? _u("store and add") : _u("add only"));
    }

    IR::RegOpnd * opndInlineCache = IR::RegOpnd::New(TyMachPtr, this->m_func);
    if (usePolymorphicInlineCache)
    {
        Lowerer::InsertMove(opndInlineCache, IR::AddrOpnd::New(propertySymOpnd->m_runtimePolymorphicInlineCache->GetInlineCachesAddr(), IR::AddrOpndKindDynamicInlineCache, this->m_func, true), instrStFld);
    }
    else
    {
        Lowerer::InsertMove(opndInlineCache, this->LoadRuntimeInlineCacheOpnd(instrStFld, propertySymOpnd, isHelper), instrStFld);
    }

    if (typeOpnd == nullptr)
    {
        typeOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
        GenerateObjectTestAndTypeLoad(instrStFld, opndBase, typeOpnd, labelHelper);
    }

    if (usePolymorphicInlineCache)
    {
        LowererMD::GenerateLoadPolymorphicInlineCacheSlot(instrStFld, opndInlineCache, typeOpnd, propertySymOpnd->m_runtimePolymorphicInlineCache->GetSize());
    }

    IR::LabelInstr * labelNext = nullptr;
    IR::RegOpnd * opndTaggedType = nullptr;
    IR::BranchInstr * lastBranchToNext = nullptr;

    if (doStore)
    {
        if (doInlineSlots)
        {
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, typeOpnd, opndInlineCache, labelNext);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, true);
            instrStFld->InsertBefore(labelNext);
        }
        if (doAuxSlots)
        {
            if (opndTaggedType == nullptr)
            {
                opndTaggedType = IR::RegOpnd::New(TyMachPtr, this->m_func);
                LowererMD::GenerateLoadTaggedType(instrStFld, typeOpnd, opndTaggedType);
            }
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, opndTaggedType, opndInlineCache, labelNext);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, false);
            instrStFld->InsertBefore(labelNext);
        }
    }

    if (doAdd)
    {
        if (doInlineSlots)
        {
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, typeOpnd, opndInlineCache, labelNext, true);
            GenerateSetObjectTypeFromInlineCache(instrStFld, opndBase, opndInlineCache, false);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, true);
            instrStFld->InsertBefore(labelNext);
        }
        if (doAuxSlots)
        {
            if (opndTaggedType == nullptr)
            {
                opndTaggedType = IR::RegOpnd::New(TyMachPtr, this->m_func);
                LowererMD::GenerateLoadTaggedType(instrStFld, typeOpnd, opndTaggedType);
            }
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, opndTaggedType, opndInlineCache, labelNext, true);
            GenerateAuxSlotAdjustmentRequiredCheck(instrStFld, opndInlineCache, labelHelper);
            GenerateSetObjectTypeFromInlineCache(instrStFld, opndBase, opndInlineCache, true);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, false);
            instrStFld->InsertBefore(labelNext);
        }
    }

    Assert(lastBranchToNext);
    lastBranchToNext->SetTarget(labelHelper);
    labelNext->Remove();

    // $helper:
    //     CALL Helper(inlineCache, base, field, src, scriptContext)
    // $fallthru:
    isHelper = true;

    // Return false to indicate the original instruction was not lowered.  Caller will insert the helper label.
    return false;
}